

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::PathDeclarationSyntax::PathDeclarationSyntax
          (PathDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,PathDescriptionSyntax *desc
          ,Token equals,Token openParen,SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *delays
          ,Token closeParen,Token semi)

{
  size_t sVar1;
  pointer ppAVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  
  uVar6 = equals._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.kind = PathDeclaration;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (attributes->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f7698;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          ._M_extent._M_extent_value;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       _M_ptr;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f75e8;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar7 = 0;
    do {
      *(PathDeclarationSyntax **)(*(long *)((long)ppAVar2 + lVar7) + 8) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  (this->desc).ptr = desc;
  (this->equals).kind = (short)uVar6;
  (this->equals).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->equals).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->equals).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->equals).info = equals.info;
  (this->openParen).kind = openParen.kind;
  (this->openParen).field_0x2 = openParen._2_1_;
  (this->openParen).numFlags = (NumericTokenFlags)openParen.numFlags.raw;
  (this->openParen).rawLen = openParen.rawLen;
  (this->openParen).info = openParen.info;
  uVar4 = *(undefined4 *)&(delays->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (delays->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->delays).super_SyntaxListBase.super_SyntaxNode.kind =
       (delays->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->delays).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->delays).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->delays).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (delays->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->delays).super_SyntaxListBase.childCount = (delays->super_SyntaxListBase).childCount;
  (this->delays).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002f7c70;
  sVar1 = (delays->elements)._M_extent._M_extent_value;
  (this->delays).elements._M_ptr = (delays->elements)._M_ptr;
  (this->delays).elements._M_extent._M_extent_value = sVar1;
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  (this->closeParen).info = closeParen.info;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (desc->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->delays).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar8 = (this->delays).elements._M_extent._M_extent_value + 1;
  if (1 < uVar8) {
    uVar8 = uVar8 >> 1;
    lVar7 = 0;
    do {
      ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->delays).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar7));
      (*ppSVar5)->parent = (SyntaxNode *)this;
      lVar7 = lVar7 + 0x30;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  return;
}

Assistant:

PathDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, PathDescriptionSyntax& desc, Token equals, Token openParen, const SeparatedSyntaxList<ExpressionSyntax>& delays, Token closeParen, Token semi) :
        MemberSyntax(SyntaxKind::PathDeclaration, attributes), desc(&desc), equals(equals), openParen(openParen), delays(delays), closeParen(closeParen), semi(semi) {
        this->desc->parent = this;
        this->delays.parent = this;
        for (auto child : this->delays)
            child->parent = this;
    }